

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O2

void __thiscall TcpConn::TmpSend(TcpConn *this)

{
  BufferChain *bc;
  int iVar1;
  BufferChain **ppBVar2;
  BufferChain **ppBVar3;
  
  if ((this->super_Buffer).m_writeTail == (BufferChain *)0x0) {
    iVar1 = Poller::Mod((this->super_PollObj).m_pPoller,&this->super_PollObj,0x12);
    if (iVar1 != 0) {
      Buffer::Clear(&this->super_Buffer);
      return;
    }
  }
  ppBVar2 = &(this->super_Buffer).m_head;
  ppBVar3 = ppBVar2;
  while (bc = *ppBVar3, bc != (BufferChain *)0x0) {
    Buffer::AddWriteChain(&this->super_Buffer,bc);
    ppBVar3 = &bc->nextpkt;
  }
  *ppBVar2 = (BufferChain *)0x0;
  (this->super_Buffer).m_end = (BufferChain *)0x0;
  return;
}

Assistant:

void TcpConn::TmpSend()
{
    // 打开epoll写入检测
    if(m_writeTail == nullptr)
    {
        int32_t ret = m_pPoller->Mod(this, EV_WRITE|EV_ET);
        if(ret != 0)
        {
            Clear();
            return;
        }
    }

    for(auto* bc = m_head; bc != nullptr; bc = bc->nextpkt)
    {
        this->AddWriteChain(bc);
    }

    m_head = nullptr;
    m_end = nullptr;
}